

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
USBSimulationDataGenerator::Initialize
          (USBSimulationDataGenerator *this,U32 simulation_sample_rate,USBAnalyzerSettings *settings
          )

{
  SimulationChannelDescriptorGroup *pSVar1;
  SimulationChannelDescriptor *pSVar2;
  U16 *pUVar3;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  pUVar3 = SimDataFS;
  if (settings->mSpeed == LOW_SPEED) {
    pUVar3 = SimDataLS;
  }
  this->mpCurrSimData = pUVar3;
  this->mAccuDur = 0.0;
  this->mFrameCnt = 1;
  ClockGenerator::Init((double)(simulation_sample_rate / 10),(int)this + 0x10);
  pSVar1 = &this->mUSBSimulationChannels;
  pSVar2 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)settings + 0x10,this->mSimulationSampleRateHz);
  this->mDP = pSVar2;
  pSVar2 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)settings + 0x20,this->mSimulationSampleRateHz);
  this->mDM = pSVar2;
  ClockGenerator::AdvanceByTimeS(0.001);
  SimulationChannelDescriptorGroup::AdvanceAll((uint)pSVar1);
  return;
}

Assistant:

void USBSimulationDataGenerator::Initialize( U32 simulation_sample_rate, USBAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    if( mSettings->mSpeed == LOW_SPEED )
        mpCurrSimData = SimDataLS;
    else
        mpCurrSimData = SimDataFS;

    mAccuDur = 0;
    mFrameCnt = 1;

    mClockGenerator.Init( simulation_sample_rate / 10, simulation_sample_rate );

    mDP = mUSBSimulationChannels.Add( settings->mDPChannel, mSimulationSampleRateHz, BIT_LOW );
    mDM = mUSBSimulationChannels.Add( settings->mDMChannel, mSimulationSampleRateHz, BIT_LOW );

    mUSBSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( .001 ) ); // insert a pause before we start
}